

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3ReadSchema(Parse *pParse)

{
  sqlite3 *db;
  int iVar1;
  
  db = pParse->db;
  iVar1 = 0;
  if ((db->init).busy == '\0') {
    iVar1 = sqlite3Init(db,&pParse->zErrMsg);
    if (iVar1 == 0) {
      iVar1 = 0;
      if (db->noSharedCache != '\0') {
        *(byte *)&db->mDbFlags = (byte)db->mDbFlags | 0x10;
      }
    }
    else {
      pParse->rc = iVar1;
      pParse->nErr = pParse->nErr + 1;
    }
  }
  return iVar1;
}

Assistant:

SQLITE_PRIVATE int sqlite3ReadSchema(Parse *pParse){
  int rc = SQLITE_OK;
  sqlite3 *db = pParse->db;
  assert( sqlite3_mutex_held(db->mutex) );
  if( !db->init.busy ){
    rc = sqlite3Init(db, &pParse->zErrMsg);
    if( rc!=SQLITE_OK ){
      pParse->rc = rc;
      pParse->nErr++;
    }else if( db->noSharedCache ){
      db->mDbFlags |= DBFLAG_SchemaKnownOk;
    }
  }
  return rc;
}